

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *nonz,int rn)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int *piVar12;
  uint uVar13;
  uint uVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int *piVar20;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_1f8;
  uint local_1b4;
  ulong local_1b0;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  int *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  int *local_110;
  int *local_108;
  pointer local_100;
  int *local_f8;
  int *local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_1a8.fpclass = cpp_dec_float_finite;
  local_1a8.prec_elem = 10;
  local_1a8.data._M_elems[0] = 0;
  local_1a8.data._M_elems[1] = 0;
  local_1a8.data._M_elems[2] = 0;
  local_1a8.data._M_elems[3] = 0;
  local_1a8.data._M_elems[4] = 0;
  local_1a8.data._M_elems[5] = 0;
  local_1a8.data._M_elems._24_5_ = 0;
  local_1a8.data._M_elems[7]._1_3_ = 0;
  local_1a8.data._M_elems[8] = 0;
  local_1a8.data._M_elems[9] = 0;
  local_1a8.exp = 0;
  local_1a8.neg = false;
  local_100 = (this->l).rval.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (this->l).ridx;
  local_f8 = (this->l).rbeg;
  piVar20 = (this->l).rorig;
  local_f0 = (this->l).rperm;
  if (0 < rn) {
    uVar9 = 0;
    do {
      iVar8 = local_f0[nonz[uVar9]];
      if (uVar9 == 0) {
        uVar14 = 0;
      }
      else {
        uVar17 = uVar9 & 0xffffffff;
        do {
          uVar18 = (uint)uVar17 - 1;
          uVar13 = uVar18 >> 1;
          uVar14 = (uint)uVar17;
          if (iVar8 <= nonz[uVar13]) break;
          nonz[uVar17] = nonz[uVar13];
          uVar17 = (ulong)uVar13;
          uVar14 = uVar13;
        } while (1 < uVar18);
      }
      uVar9 = uVar9 + 1;
      nonz[(int)uVar14] = iVar8;
    } while (uVar9 != (uint)rn);
  }
  local_128 = nonz + this->thedim;
  if (rn < 1) {
    local_1b0 = 0;
  }
  else {
    local_1b0 = 0;
    local_120 = vec;
    local_118 = eps;
    local_110 = piVar20;
    do {
      iVar7 = *nonz;
      local_1b4 = rn - 1;
      iVar19 = nonz[(long)rn + -1];
      iVar8 = 1;
      iVar11 = 0;
      if (3 < rn) {
        iVar11 = 0;
        do {
          iVar3 = nonz[iVar8];
          iVar16 = nonz[(long)iVar8 + 1];
          piVar12 = nonz + iVar11;
          if (iVar16 < iVar3) {
            iVar11 = iVar8;
            iVar16 = iVar3;
            if (iVar3 <= iVar19) goto LAB_002b6bb6;
          }
          else {
            if (iVar16 <= iVar19) goto LAB_002b6bb6;
            iVar11 = iVar8 + 1;
          }
          *piVar12 = iVar16;
          iVar8 = iVar11 * 2 + 1;
        } while (iVar8 < (int)(rn - 2U));
      }
      if ((iVar8 < (int)local_1b4) && (iVar19 < nonz[iVar8])) {
        nonz[iVar11] = nonz[iVar8];
        iVar11 = iVar8;
      }
      piVar12 = nonz + iVar11;
LAB_002b6bb6:
      *piVar12 = iVar19;
      iVar8 = piVar20[iVar7];
      local_168.data._M_elems._32_8_ = *(undefined8 *)(local_120[iVar8].m_backend.data._M_elems + 8)
      ;
      local_168.data._M_elems._0_16_ =
           *(undefined1 (*) [16])local_120[iVar8].m_backend.data._M_elems;
      puVar2 = local_120[iVar8].m_backend.data._M_elems + 4;
      local_168.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar4 = *(undefined8 *)(puVar2 + 2);
      local_168.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_1f8.exp = local_120[iVar8].m_backend.exp;
      local_168.neg = local_120[iVar8].m_backend.neg;
      local_168.fpclass = local_120[iVar8].m_backend.fpclass;
      local_168.prec_elem = local_120[iVar8].m_backend.prec_elem;
      uVar4 = *(undefined8 *)(local_120[iVar8].m_backend.data._M_elems + 8);
      local_1f8.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_1f8.data._M_elems._0_8_ = *(undefined8 *)local_120[iVar8].m_backend.data._M_elems;
      local_1f8.data._M_elems._8_8_ = *(undefined8 *)(local_120[iVar8].m_backend.data._M_elems + 2);
      puVar2 = local_120[iVar8].m_backend.data._M_elems + 4;
      local_1f8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar4 = *(undefined8 *)(puVar2 + 2);
      local_1f8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_118->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_118->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_118->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_118->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_118->m_backend).data._M_elems + 8);
      local_68.exp = (local_118->m_backend).exp;
      local_68.neg = (local_118->m_backend).neg;
      local_68.fpclass = (local_118->m_backend).fpclass;
      local_68.prec_elem = (local_118->m_backend).prec_elem;
      local_1f8.prec_elem = local_168.prec_elem;
      local_1f8.fpclass = local_168.fpclass;
      local_1f8.neg = local_168.neg;
      if ((local_168.neg == true) &&
         (local_1f8.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite)) {
        local_1f8.neg = false;
      }
      local_168.exp = local_1f8.exp;
      if ((local_68.fpclass == cpp_dec_float_NaN || local_168.fpclass == cpp_dec_float_NaN) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1f8,&local_68), iVar7 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&local_120[iVar8].m_backend,0);
      }
      else {
        local_128[-1] = iVar8;
        local_128 = local_128 + -1;
        local_1b0 = (ulong)((int)local_1b0 + 1);
        iVar7 = local_f8[iVar8];
        iVar19 = local_f8[(long)iVar8 + 1] - iVar7;
        if (iVar19 != 0 && iVar7 <= local_f8[(long)iVar8 + 1]) {
          piVar12 = local_108 + iVar7;
          pcVar21 = &local_100[iVar7].m_backend;
          do {
            iVar8 = *piVar12;
            pnVar1 = local_120 + iVar8;
            local_1a8.data._M_elems._32_8_ =
                 *(undefined8 *)(local_120[iVar8].m_backend.data._M_elems + 8);
            local_1a8.data._M_elems._0_8_ = *(undefined8 *)local_120[iVar8].m_backend.data._M_elems;
            local_1a8.data._M_elems._8_8_ =
                 *(undefined8 *)(local_120[iVar8].m_backend.data._M_elems + 2);
            puVar2 = local_120[iVar8].m_backend.data._M_elems + 4;
            local_1a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar4 = *(undefined8 *)(puVar2 + 2);
            local_1a8.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_1a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_1a8.exp = local_120[iVar8].m_backend.exp;
            local_1a8.neg = local_120[iVar8].m_backend.neg;
            local_1a8.fpclass = local_120[iVar8].m_backend.fpclass;
            local_1a8.prec_elem = local_120[iVar8].m_backend.prec_elem;
            if (local_1a8.fpclass == cpp_dec_float_NaN) {
LAB_002b6dd6:
              auVar6 = (undefined1  [16])local_168.data._M_elems._0_16_;
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems._24_5_ = 0;
              local_1f8.data._M_elems[7]._1_3_ = 0;
              local_1f8.data._M_elems._32_5_ = 0;
              local_1f8.data._M_elems[9]._1_3_ = 0;
              local_1f8.exp = 0;
              local_1f8.neg = false;
              pcVar15 = &local_168;
              if (&local_1f8 != pcVar21) {
                local_1f8.data._M_elems._32_5_ = local_168.data._M_elems._32_5_;
                local_1f8.data._M_elems[9]._1_3_ = local_168.data._M_elems[9]._1_3_;
                local_1f8.data._M_elems[4] = local_168.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_168.data._M_elems[5];
                local_1f8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
                local_1f8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
                local_1f8.data._M_elems[0] = local_168.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_168.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_168.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_168.data._M_elems[3];
                local_1f8.exp = local_168.exp;
                local_1f8.neg = local_168.neg;
                local_1f8.fpclass = local_168.fpclass;
                local_1f8.prec_elem = local_168.prec_elem;
                pcVar15 = pcVar21;
              }
              local_168.data._M_elems._0_16_ = auVar6;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_1f8,pcVar15);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1a8,&local_1f8);
              if (local_1a8.fpclass == cpp_dec_float_NaN) {
LAB_002b6e8f:
                local_1f8.data._M_elems._32_5_ = local_1a8.data._M_elems._32_5_;
                local_1f8.data._M_elems[9]._1_3_ = local_1a8.data._M_elems[9]._1_3_;
                local_1f8.data._M_elems[4] = local_1a8.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_1a8.data._M_elems[5];
                local_1f8.data._M_elems._24_5_ = local_1a8.data._M_elems._24_5_;
                local_1f8.data._M_elems[7]._1_3_ = local_1a8.data._M_elems[7]._1_3_;
                local_1f8.data._M_elems[0] = local_1a8.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_1a8.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_1a8.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_1a8.data._M_elems[3];
                local_1f8.exp = local_1a8.exp;
                local_1f8.neg = local_1a8.neg;
                local_1f8.fpclass = local_1a8.fpclass;
                local_1f8.prec_elem = local_1a8.prec_elem;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_1f8,0,(type *)0x0);
                iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1a8,&local_1f8);
                if (iVar8 != 0) goto LAB_002b6e8f;
                local_1f8.fpclass = cpp_dec_float_finite;
                local_1f8.prec_elem = 10;
                local_1f8.data._M_elems[0] = 0;
                local_1f8.data._M_elems[1] = 0;
                local_1f8.data._M_elems[2] = 0;
                local_1f8.data._M_elems[3] = 0;
                local_1f8.data._M_elems[4] = 0;
                local_1f8.data._M_elems[5] = 0;
                local_1f8.data._M_elems._24_5_ = 0;
                local_1f8.data._M_elems[7]._1_3_ = 0;
                local_1f8.data._M_elems._32_5_ = 0;
                local_1f8.data._M_elems[9]._1_3_ = 0;
                local_1f8.exp = 0;
                local_1f8.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_1f8,1e-100);
              }
              *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
                   CONCAT35(local_1f8.data._M_elems[9]._1_3_,local_1f8.data._M_elems._32_5_);
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                   local_1f8.data._M_elems._16_8_;
              *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                   CONCAT35(local_1f8.data._M_elems[7]._1_3_,local_1f8.data._M_elems._24_5_);
              *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1f8.data._M_elems._0_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_1f8.data._M_elems._8_8_
              ;
              (pnVar1->m_backend).exp = local_1f8.exp;
              (pnVar1->m_backend).neg = local_1f8.neg;
              (pnVar1->m_backend).fpclass = local_1f8.fpclass;
              (pnVar1->m_backend).prec_elem = local_1f8.prec_elem;
              uVar4 = local_1a8.data._M_elems._16_8_;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1f8,0,(type *)0x0);
              iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1a8,&local_1f8);
              auVar6 = (undefined1  [16])local_168.data._M_elems._0_16_;
              if (iVar7 != 0) goto LAB_002b6dd6;
              local_e8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
              local_e8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
              local_e8.data._M_elems[0] = local_168.data._M_elems[0];
              local_e8.data._M_elems[1] = local_168.data._M_elems[1];
              uVar4 = local_e8.data._M_elems._0_8_;
              local_e8.data._M_elems[2] = local_168.data._M_elems[2];
              local_e8.data._M_elems[3] = local_168.data._M_elems[3];
              local_e8.data._M_elems[8] = local_168.data._M_elems[8];
              local_e8.data._M_elems[9] = local_168.data._M_elems[9];
              local_e8.data._M_elems[4] = local_168.data._M_elems[4];
              local_e8.data._M_elems[5] = local_168.data._M_elems[5];
              local_e8.exp = local_168.exp;
              local_e8.neg = local_168.neg;
              local_e8.fpclass = local_168.fpclass;
              local_e8.prec_elem = local_168.prec_elem;
              local_e8.data._M_elems[0] = auVar6._0_4_;
              if (local_e8.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                local_e8.neg = (bool)(local_168.neg ^ 1);
              }
              local_1f8.fpclass = cpp_dec_float_finite;
              local_1f8.prec_elem = 10;
              local_1f8.data._M_elems[0] = 0;
              local_1f8.data._M_elems[1] = 0;
              local_1f8.data._M_elems[2] = 0;
              local_1f8.data._M_elems[3] = 0;
              local_1f8.data._M_elems[4] = 0;
              local_1f8.data._M_elems[5] = 0;
              local_1f8.data._M_elems._24_5_ = 0;
              local_1f8.data._M_elems[7]._1_3_ = 0;
              local_1f8.data._M_elems._32_5_ = 0;
              local_1f8.data._M_elems[9]._1_3_ = 0;
              local_1f8.exp = 0;
              local_1f8.neg = false;
              pcVar15 = &local_e8;
              if (&local_1f8 != pcVar21) {
                local_1f8.data._M_elems._32_5_ = local_168.data._M_elems._32_5_;
                local_1f8.data._M_elems[9]._1_3_ = local_168.data._M_elems[9]._1_3_;
                local_1f8.data._M_elems[4] = local_168.data._M_elems[4];
                local_1f8.data._M_elems[5] = local_168.data._M_elems[5];
                local_1f8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
                local_1f8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
                local_1f8.data._M_elems[0] = local_168.data._M_elems[0];
                local_1f8.data._M_elems[1] = local_168.data._M_elems[1];
                local_1f8.data._M_elems[2] = local_168.data._M_elems[2];
                local_1f8.data._M_elems[3] = local_168.data._M_elems[3];
                local_1f8.exp = local_168.exp;
                local_1f8.neg = local_e8.neg;
                local_1f8.fpclass = local_168.fpclass;
                local_1f8.prec_elem = local_168.prec_elem;
                pcVar15 = pcVar21;
              }
              local_168.data._M_elems._0_16_ = auVar6;
              local_e8.data._M_elems._0_8_ = uVar4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_1f8,pcVar15);
              local_1a8.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
              local_1a8.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
              uVar4._0_4_ = local_1f8.data._M_elems[4];
              uVar4._4_4_ = local_1f8.data._M_elems[5];
              local_1a8.data._M_elems[4] = local_1f8.data._M_elems[4];
              local_1a8.data._M_elems[5] = local_1f8.data._M_elems[5];
              local_1a8.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
              local_1a8.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
              local_1a8.data._M_elems[0] = local_1f8.data._M_elems[0];
              local_1a8.data._M_elems[1] = local_1f8.data._M_elems[1];
              local_1a8.data._M_elems[2] = local_1f8.data._M_elems[2];
              local_1a8.data._M_elems[3] = local_1f8.data._M_elems[3];
              local_1a8.exp = local_1f8.exp;
              local_1a8.neg = local_1f8.neg;
              local_1a8.prec_elem = local_1f8.prec_elem;
              local_1a8.fpclass = local_1f8.fpclass;
              local_a8.data._M_elems._32_8_ =
                   *(undefined8 *)((local_118->m_backend).data._M_elems + 8);
              local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_118->m_backend).data._M_elems;
              local_a8.data._M_elems._8_8_ =
                   *(undefined8 *)((local_118->m_backend).data._M_elems + 2);
              local_a8.data._M_elems._16_8_ =
                   *(undefined8 *)((local_118->m_backend).data._M_elems + 4);
              local_a8.data._M_elems._24_8_ =
                   *(undefined8 *)((local_118->m_backend).data._M_elems + 6);
              local_a8.exp = (local_118->m_backend).exp;
              local_a8.neg = (local_118->m_backend).neg;
              local_a8.fpclass = (local_118->m_backend).fpclass;
              local_a8.prec_elem = (local_118->m_backend).prec_elem;
              if ((local_1f8.neg == true) &&
                 (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite)) {
                local_1f8.neg = false;
              }
              if ((local_a8.fpclass != cpp_dec_float_NaN && local_1f8.fpclass != cpp_dec_float_NaN)
                 && (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_1f8,&local_a8),
                    uVar4 = local_1a8.data._M_elems._16_8_, 0 < iVar7)) {
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) =
                     local_1a8.data._M_elems._32_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                     local_1a8.data._M_elems._16_8_;
                *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                     CONCAT35(local_1a8.data._M_elems[7]._1_3_,local_1a8.data._M_elems._24_5_);
                *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1a8.data._M_elems._0_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) =
                     local_1a8.data._M_elems._8_8_;
                (pnVar1->m_backend).exp = local_1a8.exp;
                (pnVar1->m_backend).neg = local_1a8.neg;
                (pnVar1->m_backend).fpclass = local_1a8.fpclass;
                (pnVar1->m_backend).prec_elem = local_1a8.prec_elem;
                iVar8 = local_f0[iVar8];
                uVar14 = local_1b4;
                if (0 < (int)local_1b4) {
                  do {
                    uVar13 = uVar14 - 1;
                    uVar18 = uVar13 >> 1;
                    if (iVar8 <= nonz[uVar18]) break;
                    nonz[uVar14] = nonz[uVar18];
                    uVar14 = uVar18;
                  } while (1 < uVar13);
                }
                local_1b4 = local_1b4 + 1;
                nonz[(int)uVar14] = iVar8;
              }
            }
            local_1a8.data._M_elems._16_8_ = uVar4;
            piVar12 = piVar12 + 1;
            pcVar21 = pcVar21 + 1;
            bVar5 = 1 < iVar19;
            piVar20 = local_110;
            iVar19 = iVar19 + -1;
          } while (bVar5);
        }
      }
      rn = local_1b4;
    } while (0 < (int)local_1b4);
  }
  iVar8 = (int)local_1b0;
  if (0 < iVar8) {
    lVar10 = 0;
    do {
      nonz[lVar10] = local_128[lVar10];
      lVar10 = lVar10 + 1;
    } while (iVar8 != (int)lVar10);
  }
  return iVar8;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}